

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int handle_input(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_buffer_t *decryptbuf,void *input,
                size_t *inlen,ptls_handshake_properties_t *properties)

{
  uint64_t *puVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  uint8_t *puVar5;
  size_t sVar6;
  uint32_t uVar7;
  uint8_t uVar8;
  uint uVar9;
  ulong uVar10;
  code *cb;
  uint uVar11;
  uint8_t *puVar12;
  ptls_buffer_t *buf;
  ulong __n;
  size_t sVar13;
  size_t local_90;
  st_ptls_record_t local_88;
  ptls_buffer_t *local_68;
  undefined2 local_5d;
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  ulong *local_58;
  size_t local_50;
  ptls_handshake_properties_t *local_48;
  ptls_buffer_t *local_40;
  ptls_message_emitter_t *local_38;
  
  buf = &(tls->recvbuf).rec;
  puVar12 = (tls->recvbuf).rec.base;
  uVar10 = *inlen;
  local_58 = inlen;
  local_38 = emitter;
  if (uVar10 < 5 || puVar12 != (uint8_t *)0x0) {
    local_88.fragment = (uint8_t *)0x0;
    local_88.type = '\0';
    local_88._1_1_ = 0;
    local_88.version = 0;
    local_88._4_4_ = 0;
    local_88.length = 0;
    if (puVar12 == (uint8_t *)0x0) goto LAB_0010aa55;
LAB_0010aa7d:
    puVar12 = (uint8_t *)(uVar10 + (long)input);
    uVar10 = (long)puVar12 - (long)input;
    while (uVar4 = (tls->recvbuf).rec.off, uVar4 < 5) {
      if ((uint8_t *)input == puVar12) {
        return 0x202;
      }
      uVar8 = *input;
      input = (void *)((long)input + 1);
      puVar5 = (tls->recvbuf).rec.base;
      (tls->recvbuf).rec.off = uVar4 + 1;
      puVar5[uVar4] = uVar8;
      uVar10 = uVar10 - 1;
    }
    puVar5 = (((anon_struct_64_2_7cec4369_for_recvbuf *)buf)->rec).base;
    local_68 = buf;
    local_48 = properties;
    local_40 = decryptbuf;
    iVar3 = parse_record_header(&local_88,puVar5);
    if (iVar3 != 0) {
      return iVar3;
    }
    local_90 = local_88.length;
    sVar6 = local_88.length + 5;
    uVar4 = sVar6 - uVar4;
    if (uVar4 == 0) {
LAB_0010aaf5:
      local_88.fragment = puVar5 + 5;
      iVar3 = 0;
      bVar2 = true;
    }
    else {
      iVar3 = ptls_buffer_reserve(local_68,uVar4);
      if (iVar3 != 0) {
        return iVar3;
      }
      __n = uVar10;
      if (uVar4 < uVar10) {
        __n = uVar4;
      }
      sVar13 = (tls->recvbuf).rec.off;
      local_50 = sVar6;
      if (__n != 0) {
        memcpy((tls->recvbuf).rec.base + sVar13,input,__n);
        sVar13 = __n + (tls->recvbuf).rec.off;
        (tls->recvbuf).rec.off = sVar13;
        if (uVar10 < uVar4) {
          uVar4 = uVar10;
        }
        input = (void *)((long)input + uVar4);
      }
      if (sVar13 == local_50) {
        puVar5 = local_68->base;
        goto LAB_0010aaf5;
      }
      iVar3 = 0x202;
      bVar2 = false;
    }
    *local_58 = (ulong)((long)input + (*local_58 - (long)puVar12));
    if (!bVar2) {
      return iVar3;
    }
    properties = local_48;
    decryptbuf = local_40;
    buf = local_68;
    if (local_88.fragment == (uint8_t *)0x0) {
      __assert_fail("rec.fragment != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                    ,0x120e,
                    "int handle_input(ptls_t *, ptls_message_emitter_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                   );
    }
  }
  else {
    iVar3 = parse_record_header(&local_88,(uint8_t *)input);
    if (iVar3 != 0) {
      return iVar3;
    }
    local_90 = local_88.length;
    if (uVar10 < local_88.length + 5) {
LAB_0010aa55:
      local_88.fragment = (uint8_t *)0x0;
      local_88.length = 0;
      local_88.type = '\0';
      local_88._1_1_ = 0;
      local_88.version = 0;
      local_88._4_4_ = 0;
      (tls->recvbuf).rec.base = "";
      (tls->recvbuf).rec.capacity = 0;
      (tls->recvbuf).rec.off = 0;
      (tls->recvbuf).rec.is_allocated = 0;
      iVar3 = ptls_buffer_reserve(buf,5);
      if (iVar3 != 0) {
        return iVar3;
      }
      goto LAB_0010aa7d;
    }
    local_88.fragment = (uint8_t *)((long)input + 5);
    *local_58 = local_88.length + 5;
  }
  puVar12 = local_88.fragment;
  if (local_88.type == '\x14') {
    if (PTLS_STATE_SERVER_EXPECT_FINISHED < tls->state) {
      return 0x28;
    }
    if (local_90 != 1) {
      return 0x2f;
    }
    uVar11 = 0x202;
    if (*local_88.fragment != '\x01') {
      return 0x2f;
    }
    goto LAB_0010ad92;
  }
  if ((local_88.type == '\x15') ||
     ((tls->traffic_protection).dec.aead == (ptls_aead_context_t *)0x0)) {
    uVar8 = local_88.type;
    if ((local_88.type == '\x17') &&
       ((uVar8 = '\x17', (tls->field_0x160 & 1) != 0 &&
        (uVar7 = (tls->field_18).server.early_data_skipped_bytes, uVar7 != 0xffffffff))))
    goto LAB_0010acf6;
  }
  else {
    if (local_88.type != '\x17') {
      return 0x28;
    }
    iVar3 = ptls_buffer_reserve(decryptbuf,local_90 + 5);
    if (iVar3 != 0) {
      return iVar3;
    }
    local_5d = 0x317;
    local_5b = 3;
    local_5a = (undefined1)(local_90 >> 8);
    local_59 = (undefined1)local_90;
    sVar6 = ptls_aead_decrypt((tls->traffic_protection).dec.aead,decryptbuf->base + decryptbuf->off,
                              puVar12,local_90,(tls->traffic_protection).dec.seq,&local_5d,5);
    if (sVar6 == 0xffffffffffffffff) {
      if ((tls->field_0x160 & 1) == 0) {
        return 0x14;
      }
      uVar7 = (tls->field_18).server.early_data_skipped_bytes;
      if (uVar7 == 0xffffffff) {
        return 0x14;
      }
LAB_0010acf6:
      uVar9 = (int)local_90 + uVar7;
      (tls->field_18).server.early_data_skipped_bytes = uVar9;
      uVar11 = 0x202;
      if (0x10000 < uVar9) {
        return 0x28;
      }
      goto LAB_0010ad92;
    }
    puVar1 = &(tls->traffic_protection).dec.seq;
    *puVar1 = *puVar1 + 1;
    local_88.fragment = decryptbuf->base + decryptbuf->off;
    do {
      local_90 = sVar6 - 1;
      if (sVar6 == 0) {
        return 10;
      }
      uVar8 = local_88.fragment[sVar6 - 1];
      sVar6 = local_90;
    } while (uVar8 == '\0');
    local_88.type = uVar8;
    local_88.length = local_90;
  }
  if (((tls->recvbuf).mess.base == (uint8_t *)0x0) && (uVar8 != '\x16')) {
    if (uVar8 == '\x15') {
      if (local_90 == 2) {
        uVar11 = local_88.fragment[1] | 0x100;
      }
      else {
        uVar11 = 0x32;
      }
    }
    else {
      uVar11 = 10;
      if (uVar8 == '\x17') {
        if (tls->state < PTLS_STATE_CLIENT_POST_HANDSHAKE) {
          if ((tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) &&
             (uVar11 = 0, (tls->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0)) {
            decryptbuf->off = decryptbuf->off + local_90;
          }
        }
        else {
          decryptbuf->off = decryptbuf->off + local_90;
          uVar11 = 0;
        }
      }
    }
  }
  else {
    cb = handle_server_handshake_message;
    if ((tls->field_0x160 & 1) == 0) {
      cb = handle_client_handshake_message;
    }
    uVar11 = handle_handshake_record(tls,cb,local_38,&local_88,properties);
  }
LAB_0010ad92:
  ptls_buffer_dispose(buf);
  return uVar11;
}

Assistant:

static int handle_input(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_buffer_t *decryptbuf, const void *input, size_t *inlen,
                        ptls_handshake_properties_t *properties)
{
    struct st_ptls_record_t rec;
    int ret;

    /* extract the record */
    if ((ret = parse_record(tls, &rec, input, inlen)) != 0)
        return ret;
    assert(rec.fragment != NULL);

    /* decrypt the record */
    if (rec.type == PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC) {
        if (tls->state < PTLS_STATE_POST_HANDSHAKE_MIN) {
            if (!(rec.length == 1 && rec.fragment[0] == 0x01))
                return PTLS_ALERT_ILLEGAL_PARAMETER;
        } else {
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        ret = PTLS_ERROR_IN_PROGRESS;
        goto NextRecord;
    }
    if (tls->traffic_protection.dec.aead != NULL && rec.type != PTLS_CONTENT_TYPE_ALERT) {
        size_t decrypted_length;
        if (rec.type != PTLS_CONTENT_TYPE_APPDATA)
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        if ((ret = ptls_buffer_reserve(decryptbuf, 5 + rec.length)) != 0)
            return ret;
        if ((ret = aead_decrypt(&tls->traffic_protection.dec, decryptbuf->base + decryptbuf->off, &decrypted_length, rec.fragment,
                                rec.length)) != 0) {
            if (tls->is_server && tls->server.early_data_skipped_bytes != UINT32_MAX)
                goto ServerSkipEarlyData;
            return ret;
        }
        rec.length = decrypted_length;
        rec.fragment = decryptbuf->base + decryptbuf->off;
        /* skip padding */
        for (; rec.length != 0; --rec.length)
            if (rec.fragment[rec.length - 1] != 0)
                break;
        if (rec.length == 0)
            return PTLS_ALERT_UNEXPECTED_MESSAGE;
        rec.type = rec.fragment[--rec.length];
    } else if (rec.type == PTLS_CONTENT_TYPE_APPDATA && tls->is_server && tls->server.early_data_skipped_bytes != UINT32_MAX) {
        goto ServerSkipEarlyData;
    }

    if (tls->recvbuf.mess.base != NULL || rec.type == PTLS_CONTENT_TYPE_HANDSHAKE) {
        /* handshake record */
        ret = handle_handshake_record(tls, tls->is_server ? handle_server_handshake_message : handle_client_handshake_message,
                                      emitter, &rec, properties);
    } else {
        /* handling of an alert or an application record */
        switch (rec.type) {
        case PTLS_CONTENT_TYPE_APPDATA:
            if (tls->state >= PTLS_STATE_POST_HANDSHAKE_MIN) {
                decryptbuf->off += rec.length;
                ret = 0;
            } else if (tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
                if (tls->traffic_protection.dec.aead != NULL)
                    decryptbuf->off += rec.length;
                ret = 0;
            } else {
                ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            }
            break;
        case PTLS_CONTENT_TYPE_ALERT:
            ret = handle_alert(tls, rec.fragment, rec.length);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
    }

NextRecord:
    ptls_buffer_dispose(&tls->recvbuf.rec);
    return ret;

ServerSkipEarlyData:
    tls->server.early_data_skipped_bytes += (uint32_t)rec.length;
    if (tls->server.early_data_skipped_bytes > PTLS_MAX_EARLY_DATA_SKIP_SIZE)
        return PTLS_ALERT_HANDSHAKE_FAILURE;
    ret = PTLS_ERROR_IN_PROGRESS;
    goto NextRecord;
}